

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.h
# Opt level: O0

void __thiscall
CIF::UnitCell::UnitCell
          (UnitCell *this,CellGeometry *geo,
          vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *sites)

{
  vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *sites_local;
  CellGeometry *geo_local;
  UnitCell *this_local;
  
  CellGeometry::CellGeometry(&this->geometry,geo);
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&this->atoms,sites);
  return;
}

Assistant:

UnitCell(CellGeometry geo, std::vector<AtomSite> sites) : geometry(geo), atoms(sites) {}